

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitArrayCopy
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,ArrayCopy *curr)

{
  anon_union_16_5_9943fe1e_for_Literal_0 *paVar1;
  bool bVar2;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *pEVar3;
  long lVar4;
  long lVar5;
  element_type *peVar6;
  uint8_t *puVar7;
  Literal *pLVar8;
  reference pvVar9;
  pointer local_1f8;
  size_t i_1;
  size_t i;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> copied;
  size_t lengthVal;
  size_t srcVal;
  size_t destVal;
  shared_ptr<wasm::GCData> srcData;
  shared_ptr<wasm::GCData> destData;
  Flow length;
  Flow srcIndex;
  Flow srcRef;
  Flow destIndex;
  undefined1 local_68 [8];
  Flow destRef;
  ArrayCopy *curr_local;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  destRef.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar3,*(Expression **)(destRef.breakTo.super_IString.str._M_str + 0x10));
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
    visit((Flow *)&srcRef.breakTo.super_IString.str._M_str,pEVar3,
          *(Expression **)(destRef.breakTo.super_IString.str._M_str + 0x18));
    bVar2 = Flow::breaking((Flow *)&srcRef.breakTo.super_IString.str._M_str);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&srcRef.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar3 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
      visit((Flow *)&srcIndex.breakTo.super_IString.str._M_str,pEVar3,
            *(Expression **)(destRef.breakTo.super_IString.str._M_str + 0x20));
      bVar2 = Flow::breaking((Flow *)&srcIndex.breakTo.super_IString.str._M_str);
      if (bVar2) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&srcIndex.breakTo.super_IString.str._M_str);
      }
      else {
        pEVar3 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
        visit((Flow *)&length.breakTo.super_IString.str._M_str,pEVar3,
              *(Expression **)(destRef.breakTo.super_IString.str._M_str + 0x28));
        bVar2 = Flow::breaking((Flow *)&length.breakTo.super_IString.str._M_str);
        if (bVar2) {
          Flow::Flow(__return_storage_ptr__,(Flow *)&length.breakTo.super_IString.str._M_str);
        }
        else {
          pEVar3 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
          visit((Flow *)&destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,pEVar3,
                *(Expression **)(destRef.breakTo.super_IString.str._M_str + 0x30));
          bVar2 = Flow::breaking((Flow *)&destData.
                                          super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
          if (bVar2) {
            Flow::Flow(__return_storage_ptr__,
                       (Flow *)&destData.
                                super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
          }
          else {
            Flow::getSingleValue((Flow *)local_68);
            ::wasm::Literal::getGCData();
            bVar2 = std::__shared_ptr::operator_cast_to_bool
                              ((__shared_ptr *)
                               &srcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
            if (!bVar2) {
              (*this->_vptr_ExpressionRunner[2])(this,"null ref");
            }
            Flow::getSingleValue((Flow *)&srcIndex.breakTo.super_IString.str._M_str);
            ::wasm::Literal::getGCData();
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&destVal);
            if (!bVar2) {
              (*this->_vptr_ExpressionRunner[2])(this,"null ref");
            }
            Flow::getSingleValue((Flow *)&srcRef.breakTo.super_IString.str._M_str);
            lVar4 = ::wasm::Literal::getUnsigned();
            Flow::getSingleValue((Flow *)&length.breakTo.super_IString.str._M_str);
            lVar5 = ::wasm::Literal::getUnsigned();
            Flow::getSingleValue
                      ((Flow *)&destData.
                                super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
            copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)::wasm::Literal::getUnsigned();
            paVar1 = &(copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->field_0;
            peVar6 = std::
                     __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&srcData.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
            puVar7 = (uint8_t *)
                     SmallVector<wasm::Literal,_1UL>::size
                               (&(peVar6->values).super_SmallVector<wasm::Literal,_1UL>);
            if (puVar7 < paVar1->v128 + lVar4) {
              (*this->_vptr_ExpressionRunner[2])(this,"oob");
            }
            paVar1 = &(copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->field_0;
            peVar6 = std::
                     __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&destVal);
            puVar7 = (uint8_t *)
                     SmallVector<wasm::Literal,_1UL>::size
                               (&(peVar6->values).super_SmallVector<wasm::Literal,_1UL>);
            if (puVar7 < paVar1->v128 + lVar5) {
              (*this->_vptr_ExpressionRunner[2])(this,"oob");
            }
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&i);
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::resize
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&i,
                       (size_type)
                       copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
            for (i_1 = 0; i_1 < copied.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage; i_1 = i_1 + 1) {
              peVar6 = std::
                       __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&destVal);
              pLVar8 = SmallVector<wasm::Literal,_1UL>::operator[]
                                 (&(peVar6->values).super_SmallVector<wasm::Literal,_1UL>,
                                  lVar5 + i_1);
              pvVar9 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator[]
                                 ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&i,i_1);
              ::wasm::Literal::operator=(pvVar9,pLVar8);
            }
            for (local_1f8 = (pointer)0x0;
                local_1f8 <
                copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
                local_1f8 = (pointer)((long)&(local_1f8->field_0).func.super_IString.str._M_len + 1)
                ) {
              pvVar9 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator[]
                                 ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&i,
                                  (size_type)local_1f8);
              peVar6 = std::
                       __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&srcData.
                                      super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
              pLVar8 = SmallVector<wasm::Literal,_1UL>::operator[]
                                 (&(peVar6->values).super_SmallVector<wasm::Literal,_1UL>,
                                  (long)&local_1f8->field_0 + lVar4);
              ::wasm::Literal::operator=(pLVar8,pvVar9);
            }
            Flow::Flow(__return_storage_ptr__);
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&i);
            std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&destVal);
            std::shared_ptr<wasm::GCData>::~shared_ptr
                      ((shared_ptr<wasm::GCData> *)
                       &srcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          Flow::~Flow((Flow *)&destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
        }
        Flow::~Flow((Flow *)&length.breakTo.super_IString.str._M_str);
      }
      Flow::~Flow((Flow *)&srcIndex.breakTo.super_IString.str._M_str);
    }
    Flow::~Flow((Flow *)&srcRef.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayCopy(ArrayCopy* curr) {
    NOTE_ENTER("ArrayCopy");
    Flow destRef = self()->visit(curr->destRef);
    if (destRef.breaking()) {
      return destRef;
    }
    Flow destIndex = self()->visit(curr->destIndex);
    if (destIndex.breaking()) {
      return destIndex;
    }
    Flow srcRef = self()->visit(curr->srcRef);
    if (srcRef.breaking()) {
      return srcRef;
    }
    Flow srcIndex = self()->visit(curr->srcIndex);
    if (srcIndex.breaking()) {
      return srcIndex;
    }
    Flow length = self()->visit(curr->length);
    if (length.breaking()) {
      return length;
    }
    auto destData = destRef.getSingleValue().getGCData();
    if (!destData) {
      trap("null ref");
    }
    auto srcData = srcRef.getSingleValue().getGCData();
    if (!srcData) {
      trap("null ref");
    }
    size_t destVal = destIndex.getSingleValue().getUnsigned();
    size_t srcVal = srcIndex.getSingleValue().getUnsigned();
    size_t lengthVal = length.getSingleValue().getUnsigned();
    if (destVal + lengthVal > destData->values.size()) {
      trap("oob");
    }
    if (srcVal + lengthVal > srcData->values.size()) {
      trap("oob");
    }
    std::vector<Literal> copied;
    copied.resize(lengthVal);
    for (size_t i = 0; i < lengthVal; i++) {
      copied[i] = srcData->values[srcVal + i];
    }
    for (size_t i = 0; i < lengthVal; i++) {
      destData->values[destVal + i] = copied[i];
    }
    return Flow();
  }